

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

Expr * __thiscall parser::Parser::mkNode(Parser *this,Operator *op,Expr *e1,Expr *e2)

{
  ostream *poVar1;
  Parser *local_500;
  value_type local_478;
  Parser *local_458;
  CallExpression *call;
  Token local_448;
  Parser *local_418;
  Assign *assign;
  Token local_408;
  Parser *local_3d8;
  Equals *eq;
  NotEquals *nt_eq;
  Token local_3c0;
  Parser *local_390;
  GreaterThanOrEqual *gt_eq;
  Token local_380;
  Parser *local_350;
  GreaterThan *gt;
  Token local_340;
  Parser *local_310;
  LessThanOrEqual *lt_eq;
  Token local_300;
  Parser *local_2d0;
  LessThan *lt;
  Token local_2c0;
  Parser *local_290;
  Div *div;
  Not *nt;
  UniarySub *usub;
  Token local_270;
  Parser *local_240;
  Sub *sub;
  Token local_230;
  Parser *local_200;
  Mult *mul;
  Token local_1f0;
  Parser *local_1b0;
  Add *add;
  ostringstream message;
  Expr *e2_local;
  Expr *e1_local;
  Operator *op_local;
  Parser *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&add);
  switch((op->super_Token).Type) {
  case EQ:
    this_local = (Parser *)operator_new(0x58);
    assign._7_1_ = 1;
    token::Token::Token(&local_408,&op->super_Token);
    ast::Equals::Equals((Equals *)this_local,&local_408,this->l->line);
    assign._7_1_ = 0;
    token::Token::~Token(&local_408);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_3d8 = this_local;
    break;
  case NOT_EQ:
    this_local = (Parser *)operator_new(0x58);
    ast::NotEquals::NotEquals((NotEquals *)this_local,&op->super_Token,this->l->line);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    eq = (Equals *)this_local;
    break;
  case GT:
    this_local = (Parser *)operator_new(0x58);
    gt_eq._7_1_ = 1;
    token::Token::Token(&local_380,&op->super_Token);
    ast::GreaterThan::GreaterThan((GreaterThan *)this_local,&local_380,this->l->line);
    gt_eq._7_1_ = 0;
    token::Token::~Token(&local_380);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_350 = this_local;
    break;
  case LT:
    this_local = (Parser *)operator_new(0x58);
    lt_eq._7_1_ = 1;
    token::Token::Token(&local_300,&op->super_Token);
    ast::LessThan::LessThan((LessThan *)this_local,&local_300,this->l->line);
    lt_eq._7_1_ = 0;
    token::Token::~Token(&local_300);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_2d0 = this_local;
    break;
  default:
    poVar1 = std::operator<<((ostream *)&add,"couldn\'t parse operator type ");
    poVar1 = std::operator<<(poVar1,(string *)&op->symbol);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->errors,&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    this_local = (Parser *)0x0;
    break;
  case ASSIGN:
    this_local = (Parser *)operator_new(0x58);
    call._7_1_ = 1;
    token::Token::Token(&local_448,&op->super_Token);
    ast::Assign::Assign((Assign *)this_local,&local_448,this->l->line);
    call._7_1_ = 0;
    token::Token::~Token(&local_448);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_418 = this_local;
    break;
  case PLUS:
    this_local = (Parser *)operator_new(0x58);
    mul._7_1_ = 1;
    token::Token::Token(&local_1f0,&op->super_Token);
    ast::Add::Add((Add *)this_local,&local_1f0,this->l->line);
    mul._7_1_ = 0;
    token::Token::~Token(&local_1f0);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_1b0 = this_local;
    break;
  case MINUS:
    this_local = (Parser *)operator_new(0x58);
    usub._7_1_ = 1;
    token::Token::Token(&local_270,&op->super_Token);
    ast::Sub::Sub((Sub *)this_local,&local_270,this->l->line);
    usub._7_1_ = 0;
    token::Token::~Token(&local_270);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_240 = this_local;
    break;
  case BANG:
    this_local = (Parser *)operator_new(0x50);
    ast::Not::Not((Not *)this_local,&op->super_Token,this->l->line);
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    div = (Div *)this_local;
    break;
  case ASTERISK:
    this_local = (Parser *)operator_new(0x58);
    sub._7_1_ = 1;
    token::Token::Token(&local_230,&op->super_Token);
    ast::Mult::Mult((Mult *)this_local,&local_230,this->l->line);
    sub._7_1_ = 0;
    token::Token::~Token(&local_230);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_200 = this_local;
    break;
  case DIV:
    this_local = (Parser *)operator_new(0x58);
    lt._7_1_ = 1;
    token::Token::Token(&local_2c0,&op->super_Token);
    ast::Div::Div((Div *)this_local,&local_2c0,this->l->line);
    lt._7_1_ = 0;
    token::Token::~Token(&local_2c0);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_290 = this_local;
    break;
  case LT_EQ:
    this_local = (Parser *)operator_new(0x58);
    gt._7_1_ = 1;
    token::Token::Token(&local_340,&op->super_Token);
    ast::LessThanOrEqual::LessThanOrEqual((LessThanOrEqual *)this_local,&local_340,this->l->line);
    gt._7_1_ = 0;
    token::Token::~Token(&local_340);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_310 = this_local;
    break;
  case UMINUS:
    this_local = (Parser *)operator_new(0x50);
    ast::UniarySub::UniarySub((UniarySub *)this_local,&op->super_Token,this->l->line);
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    nt = (Not *)this_local;
    break;
  case GT_EQ:
    this_local = (Parser *)operator_new(0x58);
    nt_eq._7_1_ = 1;
    token::Token::Token(&local_3c0,&op->super_Token);
    ast::GreaterThanOrEqual::GreaterThanOrEqual
              ((GreaterThanOrEqual *)this_local,&local_3c0,this->l->line);
    nt_eq._7_1_ = 0;
    token::Token::~Token(&local_3c0);
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)&this_local->peekToken)[2]._M_allocated_capacity = (size_type)e1;
    *(Expr **)((long)&this_local->peekToken + 0x18) = e2;
    local_390 = this_local;
    break;
  case CALL:
    if (e2 == (Expr *)0x0) {
      local_500 = (Parser *)0x0;
    }
    else {
      local_500 = (Parser *)__dynamic_cast(e2,&ast::Expr::typeinfo,&ast::CallExpression::typeinfo,0)
      ;
    }
    local_458 = local_500;
    (local_500->peekToken).Literal._M_dataplus._M_p = (pointer)e1;
    this_local = local_500;
  }
  mul._0_4_ = 1;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&add);
  return (Expr *)this_local;
}

Assistant:

Expr* Parser::mkNode(Operator& op, Expr* e1, Expr* e2)
{
    std::ostringstream message;
    switch (op.Type) {
        case TokenType::PLUS:
             {
              auto add = new Add(op, l->line);
              add->LeftOp = e1;
              add->RightOp = e2;
              return add;
             }
        case TokenType::ASTERISK:
             {
              auto mul = new Mult(op, l->line);
              mul->LeftOp = e1;
              mul->RightOp = e2;
              return mul;
             }
        case TokenType::MINUS:
           {
             auto sub = new Sub(op, l->line);
             sub->LeftOp = e1;
             sub->RightOp = e2;
             return sub;
           }
        case TokenType::UMINUS:
           {
             auto usub = new UniarySub(op, l->line);
             usub->RightOp = e2;
             return usub;
           }
        case TokenType::BANG:
          {
             auto nt = new Not(op, l->line);
             nt->RightOp = e2;
             return nt;
          }
        case TokenType::DIV:
          {
            auto div = new Div(op, l->line);
            div->LeftOp = e1;
            div->RightOp = e2;
            return div;
          }
         case TokenType::LT:
         {
             auto lt = new LessThan(op, l->line);
             lt->LeftOp = e1;
             lt->RightOp = e2;
             return lt;
         }
         case TokenType::LT_EQ:
          {
             auto lt_eq = new LessThanOrEqual(op, l->line);
             lt_eq->LeftOp = e1;
             lt_eq->RightOp = e2;
             return lt_eq;
          }
          case TokenType::GT:
           {
              auto gt = new GreaterThan(op, l->line);
              gt->LeftOp = e1;
              gt->RightOp = e2;
              return gt;
           }
           case TokenType::GT_EQ:
            {
               auto gt_eq = new GreaterThanOrEqual(op, l->line);
               gt_eq->LeftOp = e1;
               gt_eq->RightOp = e2;
               return gt_eq;
            }
            case TokenType::NOT_EQ:
             {
                auto nt_eq = new NotEquals(op, l->line);
                nt_eq->LeftOp = e1;
                nt_eq->RightOp = e2;
                return nt_eq;
             }
            case TokenType::EQ:
            {
               auto eq = new Equals(op, l->line);
               eq->LeftOp = e1;
               eq->RightOp = e2;
               return eq;
            }
            case TokenType::ASSIGN:
            {
               auto assign = new Assign(op, l->line);
               assign->LeftOp = e1;
               assign->RightOp = e2;
               return assign;
            }
            case TokenType::CALL:
             {
               auto call = dynamic_cast<CallExpression*>(e2);
               call->function = e1;
               return call;
             }
        default:
             message << "couldn't parse operator type " << op.symbol
                   << endl;
             errors.push_back(message.str());
             return nullptr;
    }
}